

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec_utils.c
# Opt level: O3

int bgpsec_segment_to_str(char *buffer,rtr_signature_seg *sig_seg,rtr_secure_path_seg *sec_path)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char *__s;
  long in_FS_OFFSET;
  char byte_buffer [256];
  char acStack_138 [256];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(acStack_138,0,0x100);
  builtin_strncpy(buffer,"++++++++++++++++++++++++++++++++++++++++\nSignature Segment:\n\tSKI:\n",
                  0x43);
  byte_sequence_to_str(acStack_138,sig_seg->ski,0x14,2);
  iVar1 = sprintf(buffer + 0x42,"%s\n",acStack_138);
  lVar2 = (long)iVar1;
  __s = buffer + lVar2 + 0x42;
  iVar1 = sprintf(__s,"\tLength: %d\n",(ulong)sig_seg->sig_len);
  lVar3 = (long)iVar1;
  builtin_strncpy(buffer + lVar3 + lVar2 + 0x42,"\tSignature:\n",0xd);
  memset(acStack_138,0,0x100);
  byte_sequence_to_str(acStack_138,sig_seg->signature,(uint)sig_seg->sig_len,2);
  iVar1 = sprintf(__s + lVar3 + 0xc,"%s\n",acStack_138);
  lVar4 = (long)iVar1;
  builtin_strncpy(buffer + lVar4 + lVar3 + lVar2 + 0x4e,"----------------------------------------\n"
                  ,0x2a);
  iVar1 = sprintf(__s + lVar4 + 0x35 + lVar3,
                  "Secure_Path Segment:\n\tpCount: %d\n\tFlags: %d\n\tAS number: %d\n",
                  (ulong)sec_path->pcount,(ulong)sec_path->flags,(ulong)sec_path->asn);
  builtin_strncpy(buffer + iVar1 + lVar4 + lVar3 + lVar2 + 0x77,
                  "++++++++++++++++++++++++++++++++++++++++\n\n",0x2b);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int bgpsec_segment_to_str(char *buffer, struct rtr_signature_seg *sig_seg, struct rtr_secure_path_seg *sec_path)
{
	char byte_buffer[256] = {'\0'};

	buffer += sprintf(buffer, "++++++++++++++++++++++++++++++++++++++++\n");
	buffer += sprintf(buffer, "Signature Segment:\n");
	buffer += sprintf(buffer, "\tSKI:\n");

	byte_sequence_to_str(byte_buffer, sig_seg->ski, SKI_SIZE, 2);
	buffer += sprintf(buffer, "%s\n", byte_buffer);

	buffer += sprintf(buffer, "\tLength: %d\n", sig_seg->sig_len);
	buffer += sprintf(buffer, "\tSignature:\n");

	memset(byte_buffer, 0, sizeof(byte_buffer));
	byte_sequence_to_str(byte_buffer, sig_seg->signature, sig_seg->sig_len, 2);
	buffer += sprintf(buffer, "%s\n", byte_buffer);

	buffer += sprintf(buffer, "----------------------------------------\n");
	buffer += sprintf(buffer,
			  "Secure_Path Segment:\n"
			  "\tpCount: %d\n"
			  "\tFlags: %d\n"
			  "\tAS number: %d\n",
			  sec_path->pcount, sec_path->flags, sec_path->asn);
	buffer += sprintf(buffer, "++++++++++++++++++++++++++++++++++++++++\n");
	buffer += sprintf(buffer, "\n");
	*buffer = '\0';

	return RTR_BGPSEC_SUCCESS;
}